

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DDict * ZSTD_getDDict(ZSTD_DCtx *dctx)

{
  int iVar1;
  long in_RDI;
  ZSTD_DDict *local_8;
  
  iVar1 = *(int *)(in_RDI + 0x7600);
  if (iVar1 == -1) {
    local_8 = *(ZSTD_DDict **)(in_RDI + 0x75f0);
  }
  else if (iVar1 == 0) {
    ZSTD_clearDict((ZSTD_DCtx *)0x2f491d);
    local_8 = (ZSTD_DDict *)0x0;
  }
  else {
    if (iVar1 != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9fd2,"const ZSTD_DDict *ZSTD_getDDict(ZSTD_DCtx *)");
    }
    *(undefined4 *)(in_RDI + 0x7600) = 0;
    local_8 = *(ZSTD_DDict **)(in_RDI + 0x75f0);
  }
  return local_8;
}

Assistant:

static ZSTD_DDict const* ZSTD_getDDict(ZSTD_DCtx* dctx)
{
    switch (dctx->dictUses) {
    default:
        assert(0 /* Impossible */);
        ZSTD_FALLTHROUGH;
    case ZSTD_dont_use:
        ZSTD_clearDict(dctx);
        return NULL;
    case ZSTD_use_indefinitely:
        return dctx->ddict;
    case ZSTD_use_once:
        dctx->dictUses = ZSTD_dont_use;
        return dctx->ddict;
    }
}